

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_hash_size.hpp
# Opt level: O0

void digestpp::detail::validate_hash_size(size_t hs,size_t max)

{
  runtime_error *prVar1;
  size_t max_local;
  size_t hs_local;
  
  if (hs == 0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"hash size can\'t be zero");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((hs & 7) != 0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"non-byte hash sizes are not supported");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (max < hs) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"invalid hash size");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

inline void validate_hash_size(size_t hs, size_t max)
{
	if (!hs)
		throw std::runtime_error("hash size can't be zero");

	if (hs % 8)
		throw std::runtime_error("non-byte hash sizes are not supported");

	if (hs > max)
		throw std::runtime_error("invalid hash size");
}